

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O1

void __thiscall
CustomUintFormatter<6,false>::Ser<VectorWriter,unsigned_long>
          (CustomUintFormatter<6,false> *this,VectorWriter *s,unsigned_long v)

{
  char *pcVar1;
  size_t in_RCX;
  long in_FS_OFFSET;
  uint64_t raw;
  unsigned_long local_30;
  undefined8 local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (v >> 0x30 == 0) {
    local_30 = v;
    VectorWriter::write(s,(int)&local_30,(void *)0x6,in_RCX);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
  else {
    pcVar1 = (char *)__cxa_allocate_exception(0x20);
    local_28 = std::iostream_category();
    local_30 = CONCAT44(local_30._4_4_,1);
    std::ios_base::failure[abi:cxx11]::failure
              (pcVar1,(error_code *)"CustomUintFormatter value out of range");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      __cxa_throw(pcVar1,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  __stack_chk_fail();
}

Assistant:

void Ser(Stream& s, I v)
    {
        if (v < 0 || v > MAX) throw std::ios_base::failure("CustomUintFormatter value out of range");
        if (BigEndian) {
            uint64_t raw = htobe64_internal(v);
            s.write(AsBytes(Span{&raw, 1}).last(Bytes));
        } else {
            uint64_t raw = htole64_internal(v);
            s.write(AsBytes(Span{&raw, 1}).first(Bytes));
        }
    }